

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O3

bool __thiscall sshash::map::update(map *this,string *hash,string *str,string *elf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  dummy_u *pdVar3;
  long *plVar4;
  string __hs;
  string __he;
  string ex;
  undefined1 *local_108;
  long local_100;
  undefined1 local_f8 [16];
  undefined1 *local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  path_type local_c8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  dummy_u local_70;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_108 = local_f8;
  pcVar2 = (hash->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar2,pcVar2 + hash->_M_string_length);
  std::__cxx11::string::append((char *)&local_108);
  local_e8 = local_d8;
  pcVar2 = (hash->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar2,pcVar2 + hash->_M_string_length);
  std::__cxx11::string::append((char *)&local_e8);
  paVar1 = &local_c8.m_value.field_2;
  local_c8.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_108,local_108 + local_100);
  local_c8.m_separator = '.';
  local_c8.m_start._M_current = local_c8.m_value._M_dataplus._M_p;
  local_70._8_8_ = 0;
  local_70.data[0x10] = '\0';
  local_70.aligner_ = (type)((long)local_70.data + 0x10);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            (&local_98,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)this,&local_c8);
  pdVar3 = &local_70;
  if (local_98.super_type.m_initialized != false) {
    pdVar3 = &local_98.super_type.m_storage.dummy_;
  }
  local_50 = local_40;
  plVar4 = (long *)(local_70.data + 8);
  if (local_98.super_type.m_initialized != false) {
    plVar4 = (long *)((long)&local_98.super_type.m_storage.dummy_ + 8);
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pdVar3->aligner_,*plVar4 + (long)pdVar3->aligner_);
  if ((local_98.super_type.m_initialized == true) &&
     (local_98.super_type.m_storage.dummy_.aligner_ !=
      (type)((long)&local_98.super_type.m_storage.dummy_ + 0x10))) {
    operator_delete((void *)local_98.super_type.m_storage.dummy_.aligner_);
  }
  if (local_70.aligner_ != (type)((long)local_70.data + 0x10)) {
    operator_delete((void *)local_70.aligner_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.m_value._M_dataplus._M_p);
  }
  if (local_48 == 0) {
    local_c8.m_value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_108,local_108 + local_100);
    local_c8.m_separator = '.';
    local_c8.m_start._M_current = local_c8.m_value._M_dataplus._M_p;
    boost::property_tree::
    basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
    put<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
              ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                *)this,&local_c8,str);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.m_value._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8.m_value._M_dataplus._M_p);
    }
    local_c8.m_value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_e8,local_e8 + local_e0);
    local_c8.m_separator = '.';
    local_c8.m_start._M_current = local_c8.m_value._M_dataplus._M_p;
    boost::property_tree::
    basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
    put<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
              ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                *)this,&local_c8,elf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.m_value._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8.m_value._M_dataplus._M_p);
    }
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  if (local_108 != local_f8) {
    operator_delete(local_108);
  }
  return local_48 == 0;
}

Assistant:

bool map::update(const std::string& hash, const std::string& str, const std::string& elf)
{
	std::string __hs = hash + ".str";
	std::string __he = hash + ".elf";

	std::string ex = this->get<std::string>(__hs, std::string());
	if (!ex.empty())
		return false;

	this->put(__hs, str);
	this->put(__he, elf);

	return true;
}